

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

bool QtPrivate::isLatin1(QStringView s)

{
  storage_type_conflict sVar1;
  bool bVar2;
  storage_type_conflict *psVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  char *end8;
  char16_t *end;
  char16_t *ptr;
  char *ptr8;
  storage_type_conflict *local_30;
  bool local_21;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  psVar3 = QStringView::utf16(&local_18);
  qVar4 = QStringView::size(&local_18);
  bVar2 = simdTestMask((char **)s.m_size,(char *)s.m_data,ptr8._4_4_);
  local_30 = psVar3;
  if (bVar2) {
    do {
      if (local_30 == psVar3 + qVar4) {
        local_21 = true;
        goto LAB_001d0df8;
      }
      sVar1 = *local_30;
      local_30 = local_30 + 1;
    } while ((ushort)sVar1 < 0x100);
    local_21 = false;
  }
  else {
    local_21 = false;
  }
LAB_001d0df8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool QtPrivate::isLatin1(QStringView s) noexcept
{
    const char16_t *ptr = s.utf16();
    const char16_t *end = ptr + s.size();

#ifdef __SSE2__
    const char *ptr8 = reinterpret_cast<const char *>(ptr);
    const char *end8 = reinterpret_cast<const char *>(end);
    if (!simdTestMask(ptr8, end8, 0xff00ff00))
        return false;
    ptr = reinterpret_cast<const char16_t *>(ptr8);
#endif

    while (ptr != end) {
        if (*ptr++ > 0xff)
            return false;
    }
    return true;
}